

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::AssertSnapEquiv
               (SnapPrimitiveValue *v1,SnapPrimitiveValue *v2,TTDCompareMap *compareMap)

{
  bool bVar1;
  int iVar2;
  bool local_41;
  bool local_31;
  bool local_21;
  TTDCompareMap *compareMap_local;
  SnapPrimitiveValue *v2_local;
  SnapPrimitiveValue *v1_local;
  
  TTDCompareMap::DiagnosticAssert(compareMap,v1->SnapType->JsTypeId == v2->SnapType->JsTypeId);
  NSSnapType::AssertSnapEquiv(v1->SnapType,v2->SnapType,compareMap);
  if ((v1->OptWellKnownToken == (TTD_WELLKNOWN_TOKEN)0x0) &&
     (v2->OptWellKnownToken == (TTD_WELLKNOWN_TOKEN)0x0)) {
    switch(v1->SnapType->JsTypeId) {
    case TypeIds_Undefined:
    case TypeIds_Null:
      break;
    case TypeIds_Boolean:
      TTDCompareMap::DiagnosticAssert
                (compareMap,((v1->field_3).u_boolValue != 0) == ((v2->field_3).u_boolValue != 0));
      break;
    default:
      TTDAbort_unrecoverable_error
                ("These are supposed to be primitive values e.g., no pointers or properties.");
    case TypeIds_Number:
      bVar1 = CheckSnapEquivTTDDouble((v1->field_3).u_doubleValue,(v2->field_3).u_doubleValue);
      TTDCompareMap::DiagnosticAssert(compareMap,bVar1);
      break;
    case TypeIds_Int64Number:
      TTDCompareMap::DiagnosticAssert
                (compareMap,(v1->field_3).u_int64Value == (v2->field_3).u_int64Value);
      break;
    case TypeIds_LastNumberType:
      TTDCompareMap::DiagnosticAssert
                (compareMap,(v1->field_3).u_int64Value == (v2->field_3).u_int64Value);
      break;
    case TypeIds_String:
      bVar1 = TTStringEQForDiagnostics((v1->field_3).u_stringValue,(v2->field_3).u_stringValue);
      TTDCompareMap::DiagnosticAssert(compareMap,bVar1);
      break;
    case TypeIds_Symbol:
      TTDCompareMap::DiagnosticAssert
                (compareMap,(v1->field_3).u_boolValue == (v2->field_3).u_boolValue);
    }
  }
  else {
    local_21 = false;
    if (v1->OptWellKnownToken != (TTD_WELLKNOWN_TOKEN)0x0) {
      local_21 = v2->OptWellKnownToken != (TTD_WELLKNOWN_TOKEN)0x0;
    }
    TTDCompareMap::DiagnosticAssert(compareMap,local_21);
    local_31 = true;
    if (v1->OptWellKnownToken != v2->OptWellKnownToken) {
      local_41 = false;
      if ((v1->OptWellKnownToken != (TTD_WELLKNOWN_TOKEN)0x0) &&
         (local_41 = false, v2->OptWellKnownToken != (TTD_WELLKNOWN_TOKEN)0x0)) {
        iVar2 = PAL_wcscmp(v1->OptWellKnownToken,v2->OptWellKnownToken);
        local_41 = iVar2 == 0;
      }
      local_31 = local_41;
    }
    TTDCompareMap::DiagnosticAssert(compareMap,local_31);
  }
  return;
}

Assistant:

void AssertSnapEquiv(const SnapPrimitiveValue* v1, const SnapPrimitiveValue* v2, TTDCompareMap& compareMap)
        {
            compareMap.DiagnosticAssert(v1->SnapType->JsTypeId == v2->SnapType->JsTypeId);

            NSSnapType::AssertSnapEquiv(v1->SnapType, v2->SnapType, compareMap);

            if(v1->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN || v2->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN)
            {
                compareMap.DiagnosticAssert(v1->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN && v2->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN);
                compareMap.DiagnosticAssert(TTD_DIAGNOSTIC_COMPARE_WELLKNOWN_TOKENS(v1->OptWellKnownToken, v2->OptWellKnownToken));
            }
            else
            {
                switch(v1->SnapType->JsTypeId)
                {
                case Js::TypeIds_Undefined:
                case Js::TypeIds_Null:
                    break;
                case Js::TypeIds_Boolean:
                    compareMap.DiagnosticAssert((!!v1->u_boolValue) == (!!v2->u_boolValue));
                    break;
                case Js::TypeIds_Number:
                    compareMap.DiagnosticAssert(CheckSnapEquivTTDDouble(v1->u_doubleValue, v2->u_doubleValue));
                    break;
                case Js::TypeIds_Int64Number:
                    compareMap.DiagnosticAssert(v1->u_int64Value == v2->u_int64Value);
                    break;
                case Js::TypeIds_UInt64Number:
                    compareMap.DiagnosticAssert(v1->u_uint64Value == v2->u_uint64Value);
                    break;
                case Js::TypeIds_String:
                    compareMap.DiagnosticAssert(TTStringEQForDiagnostics(*(v1->u_stringValue), *(v2->u_stringValue)));
                    break;
                case Js::TypeIds_Symbol:
                    compareMap.DiagnosticAssert(v1->u_propertyIdValue == v2->u_propertyIdValue);
                    break;
                default:
                    TTDAssert(false, "These are supposed to be primitive values e.g., no pointers or properties.");
                    break;
                }
            }
        }